

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::
FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::runTest(FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *this)

{
  int iVar1;
  undefined4 extraout_var;
  StatementP stmt;
  ExprP<tcu::Matrix<float,_3,_2>_> expr;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  variables;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  inputs;
  Random *in_stack_fffffffffffffed8;
  allocator<char> local_119;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  local_118;
  string local_108;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_e8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_88;
  
  iVar1 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])();
  generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            (&local_88,(BuiltinPrecisionTests *)CONCAT44(extraout_var,iVar1),
             (Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)&(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.floatFormat,
             (FloatFormat *)(ulong)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.precision,
             (Precision)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.numRandoms,
             (size_t)&(this->super_FuncCaseBase).super_PrecisionCase.m_rnd,in_stack_fffffffffffffed8
            );
  local_e8.out1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.out1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.out0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.out0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  local_e8.in3.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.in3.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.in2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.in2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.in1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.in1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  local_e8.in0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.in0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"out0",&local_119);
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  operator=(&local_e8.out0.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
            ,(SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
              *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  release((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_> *
          )&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"out1",&local_119);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::operator=(&local_e8.out1.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ,&local_118);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::release(&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"in0",&local_119);
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  operator=((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             *)&local_e8,
            (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  release((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_> *
          )&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"in1",&local_119);
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  operator=(&local_e8.in1.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
            ,(SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
              *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>::
  release((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_> *
          )&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"in2",&local_119);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::operator=(&local_e8.in2.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ,&local_118);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::release(&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"in3",&local_119);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_118,&local_108);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::operator=(&local_e8.in3.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ,&local_118);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::release(&local_118);
  std::__cxx11::string::~string((string *)&local_108);
  applyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            ((BuiltinPrecisionTests *)&local_108,this->m_func,&local_e8.in0,&local_e8.in1,
             &local_e8.in2,&local_e8.in3);
  variableAssignment<tcu::Matrix<float,3,2>>
            ((BuiltinPrecisionTests *)&local_118,&local_e8.out0,
             (ExprP<tcu::Matrix<float,_3,_2>_> *)&local_108);
  PrecisionCase::
  testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void>>
            ((PrecisionCase *)this,&local_e8,&local_88,(Statement *)local_118.m_ptr);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::~SharedPtr
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *)&local_118);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_> *)
             &local_108);
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::~Variables(&local_e8);
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::~Inputs(&local_88);
  return;
}

Assistant:

void FuncCase<Sig>::runTest (void)
{
	const Inputs<In>	inputs	(generateInputs(getSamplings(),
												m_ctx.floatFormat,
												m_ctx.precision,
												m_ctx.numRandoms,
												m_rnd));
	Variables<In, Out>	variables;

	variables.out0	= variable<Ret>("out0");
	variables.out1	= variable<Void>("out1");
	variables.in0	= variable<Arg0>("in0");
	variables.in1	= variable<Arg1>("in1");
	variables.in2	= variable<Arg2>("in2");
	variables.in3	= variable<Arg3>("in3");

	{
		ExprP<Ret>	expr	= applyVar(m_func,
									   variables.in0, variables.in1,
									   variables.in2, variables.in3);
		StatementP	stmt	= variableAssignment(variables.out0, expr);

		this->testStatement(variables, inputs, *stmt);
	}
}